

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = 2.0;
  local_18 = 1.0;
  local_20 = 1e-12;
  dVar2 = numerary::Numerary::incgamma(&local_10,&local_18,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"IncGamma(2, 1) = ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

    double value;

    value = Numerary::incgamma(2, 1);

    cout << "IncGamma(2, 1) = " << value << endl;
    
    return 0;
}